

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
argparse::Argument::get<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,Argument *this)

{
  bool bVar1;
  const_reference __any;
  logic_error *this_00;
  Argument *this_local;
  
  bVar1 = std::vector<std::any,_std::allocator<std::any>_>::empty(&this->mValues);
  if (bVar1) {
    bVar1 = std::any::has_value(&this->mDefaultValue);
    if (!bVar1) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"No value provided");
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    std::any_cast<std::__cxx11::string>(__return_storage_ptr__,&this->mDefaultValue);
  }
  else {
    __any = std::vector<std::any,_std::allocator<std::any>_>::front(&this->mValues);
    std::any_cast<std::__cxx11::string>(__return_storage_ptr__,__any);
  }
  return __return_storage_ptr__;
}

Assistant:

T get() const {
    if (!mValues.empty()) {
      if constexpr (details::is_container_v<T>)
        return any_cast_container<T>(mValues);
      else
        return std::any_cast<T>(mValues.front());
    }
    if (mDefaultValue.has_value()) {
      return std::any_cast<T>(mDefaultValue);
    }
    throw std::logic_error("No value provided");
  }